

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int ERKStepWFtolerances(void *arkode_mem,ARKEwtFn efun)

{
  long in_RDI;
  ARKodeMem ark_mem;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ERKStep","ERKStepWFtolerances",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_4 = arkWFtolerances(in_stack_ffffffffffffffd8,(ARKEwtFn)0xea603e);
  }
  return local_4;
}

Assistant:

int ERKStepWFtolerances(void *arkode_mem, ARKEwtFn efun)
{
  /* unpack ark_mem, call arkWFtolerances, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepWFtolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkWFtolerances(ark_mem, efun));
}